

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmqBrokerServer.cpp
# Opt level: O0

void __thiscall helics::apps::zmqBrokerServer::processArgs(zmqBrokerServer *this,string_view args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Error *ce;
  App parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  App *this_00;
  allocator<char> *in_stack_fffffffffffffae0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffae8;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  string *in_stack_fffffffffffffb60;
  string *in_stack_fffffffffffffb68;
  App *in_stack_fffffffffffffb70;
  allocator<char> local_471 [40];
  allocator<char> local_449;
  undefined8 in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbc8;
  App *in_stack_fffffffffffffbd0;
  allocator<char> local_421 [40];
  allocator<char> local_3f9 [40];
  basic_string_view<char,_std::char_traits<char>_> local_3d1 [3];
  allocator<char> local_399 [208];
  undefined1 in_stack_fffffffffffffd37;
  string *in_stack_fffffffffffffd38;
  App *in_stack_fffffffffffffd40;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  __t = local_3d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__t,in_stack_fffffffffffffae0);
  CLI::App::App(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::__cxx11::string::~string(in_stack_fffffffffffffab0);
  std::allocator<char>::~allocator((allocator<char> *)local_3d1);
  std::__cxx11::string::~string(in_stack_fffffffffffffab0);
  std::allocator<char>::~allocator(local_399);
  CLI::App::allow_extras((App *)(local_399 + 0x21),true);
  __a = local_3f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__t,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__t,__a);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0,
             (string *)in_stack_fffffffffffffbb8);
  std::__cxx11::string::~string(in_stack_fffffffffffffab0);
  std::allocator<char>::~allocator(local_421);
  std::__cxx11::string::~string(in_stack_fffffffffffffab0);
  std::allocator<char>::~allocator((allocator<char> *)local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__t,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__t,__a);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
             (string *)in_stack_fffffffffffffbb8);
  std::__cxx11::string::~string(in_stack_fffffffffffffab0);
  std::allocator<char>::~allocator(local_471);
  std::__cxx11::string::~string(in_stack_fffffffffffffab0);
  std::allocator<char>::~allocator(&local_449);
  this_00 = (App *)&stack0xfffffffffffffb67;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_RDI,__t,__a);
  CLI::App::parse(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                  (bool)in_stack_fffffffffffffd37);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb67);
  CLI::App::~App(this_00);
  return;
}

Assistant:

void zmqBrokerServer::processArgs(std::string_view args)

{
    CLI::App parser("zmq broker server parser");
    parser.allow_extras();
    parser.add_option("--zmq_port", mZmqPort, "specify the zmq port to use");
    parser.add_option("--zmq_interface",
                      mZmqInterface,
                      "specify the interface to use for connecting the zmq broker server");

    try {
        parser.parse(std::string(args));
    }
    catch (const CLI::Error& ce) {
        logMessage(std::string("error processing command line arguments for web server :") +
                   ce.what());
    }
}